

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_scanLit(int open,ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int t;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  int open_local;
  
  iVar2 = (int)ptr;
  end_local = ptr;
  do {
    if ((long)end - (long)end_local < 1) {
      return -1;
    }
    uVar1 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*end_local);
    switch(uVar1) {
    case 0:
    case 1:
    case 8:
      *nextTokPtr = end_local;
      return 0;
    default:
      end_local = end_local + 1;
      break;
    case 5:
      if ((long)end - (long)end_local < 2) {
        return -2;
      }
      iVar2 = (*enc[3].nameLength)(enc,end_local);
      if (iVar2 != 0) {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 2;
      iVar2 = extraout_EDX;
      break;
    case 6:
      if ((long)end - (long)end_local < 3) {
        return -2;
      }
      pcVar3 = (*enc[3].skipS)(enc,end_local);
      if ((int)pcVar3 != 0) {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 3;
      iVar2 = extraout_EDX_00;
      break;
    case 7:
      if ((long)end - (long)end_local < 4) {
        return -2;
      }
      iVar2 = (*enc[3].getAtts)(enc,end_local,iVar2,(ATTRIBUTE *)end_local);
      if (iVar2 != 0) {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 4;
      iVar2 = extraout_EDX_01;
      break;
    case 0xc:
    case 0xd:
      end_local = end_local + 1;
      if (uVar1 == open) {
        if ((long)end - (long)end_local < 1) {
          enc_local._4_4_ = -0x1b;
        }
        else {
          *nextTokPtr = end_local;
          uVar1 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*end_local);
          if (((uVar1 - 9 < 3) || (uVar1 - 0x14 < 2)) || (uVar1 == 0x1e)) {
            enc_local._4_4_ = 0x1b;
          }
          else {
            enc_local._4_4_ = 0;
          }
        }
        return enc_local._4_4_;
      }
    }
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(scanLit)(int open, const ENCODING *enc, const char *ptr, const char *end,
                const char **nextTokPtr) {
  while (HAS_CHAR(enc, ptr, end)) {
    int t = BYTE_TYPE(enc, ptr);
    switch (t) {
      INVALID_CASES(ptr, nextTokPtr)
    case BT_QUOT:
    case BT_APOS:
      ptr += MINBPC(enc);
      if (t != open)
        break;
      if (! HAS_CHAR(enc, ptr, end))
        return -XML_TOK_LITERAL;
      *nextTokPtr = ptr;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S:
      case BT_CR:
      case BT_LF:
      case BT_GT:
      case BT_PERCNT:
      case BT_LSQB:
        return XML_TOK_LITERAL;
      default:
        return XML_TOK_INVALID;
      }
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}